

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Prepare(sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pReprepare,
                  sqlite3_stmt **ppStmt,char **pzTail)

{
  int *piVar1;
  Mem *p;
  Btree *pBVar2;
  char *__src;
  sqlite3 *db_00;
  Vdbe *pVVar3;
  int iVar4;
  char *pcVar5;
  u8 uVar6;
  long lVar7;
  size_t __n;
  long lVar8;
  ulong __n_00;
  u32 local_1e4;
  sqlite3_stmt **local_1e0;
  char *local_1d8;
  Parse local_1d0;
  
  local_1e0 = ppStmt;
  memset(&local_1d0.zErrMsg,0,0xd8);
  memset(&local_1d0.sLastToken,0,0x88);
  local_1d0.pOuterParse = db->pParse;
  db->pParse = &local_1d0;
  local_1d0.db = db;
  local_1d0.pReprepare = pReprepare;
  if (db->mallocFailed != '\0') {
    sqlite3ErrorMsg(&local_1d0,"out of memory");
  }
  uVar6 = (u8)prepFlags;
  if ((prepFlags & 1) != 0) {
    local_1d0.disableLookaside = local_1d0.disableLookaside + '\x01';
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    (db->lookaside).sz = 0;
  }
  local_1d8 = zSql;
  local_1d0.prepFlags = uVar6;
  if ((db->noSharedCache == '\0') && (iVar4 = db->nDb, 0 < iVar4)) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pBVar2 = *(Btree **)((long)&db->aDb->pBt + lVar8);
      if (pBVar2 != (Btree *)0x0) {
        if ((pBVar2->sharable != '\0') &&
           (pBVar2->wantToLock = pBVar2->wantToLock + 1, pBVar2->locked == '\0')) {
          btreeLockCarefully(pBVar2);
        }
        iVar4 = querySharedCacheTableLock(pBVar2,1,'\x01');
        if (pBVar2->sharable != '\0') {
          piVar1 = &pBVar2->wantToLock;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            unlockBtreeMutex(pBVar2);
          }
        }
        if (iVar4 != 0) {
          sqlite3ErrorWithMsg(db,iVar4,"database schema is locked: %s",
                              *(undefined8 *)((long)&db->aDb->zDbSName + lVar8));
          goto LAB_0016acd2;
        }
        iVar4 = db->nDb;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x20;
    } while (lVar7 < iVar4);
  }
  if (db->pDisconnect != (VTable *)0x0) {
    sqlite3VtabUnlockList(db);
  }
  __src = local_1d8;
  if ((nBytes < 0) ||
     ((__n_00 = (ulong)(uint)nBytes, nBytes != 0 && (local_1d8[__n_00 - 1] == '\0')))) {
    sqlite3RunParser(&local_1d0,local_1d8);
  }
  else {
    if (db->aLimit[1] < nBytes) {
      sqlite3ErrorWithMsg(db,0x12,"statement too long");
      iVar4 = apiHandleError(db,0x12);
      goto LAB_0016acd2;
    }
    if ((local_1d8 == (char *)0x0) ||
       (pcVar5 = (char *)sqlite3DbMallocRawNN(db,__n_00 + 1), pcVar5 == (char *)0x0)) {
      local_1d0.zTail = __src + __n_00;
    }
    else {
      memcpy(pcVar5,__src,__n_00);
      pcVar5[__n_00] = '\0';
      sqlite3RunParser(&local_1d0,pcVar5);
      local_1d0.zTail = __src + ((long)local_1d0.zTail - (long)pcVar5);
      sqlite3DbFreeNN(db,pcVar5);
    }
  }
  pVVar3 = local_1d0.pVdbe;
  if (pzTail != (char **)0x0) {
    *pzTail = local_1d0.zTail;
  }
  if (((db->init).busy == '\0') && (local_1d0.pVdbe != (Vdbe *)0x0)) {
    (local_1d0.pVdbe)->prepFlags = uVar6;
    if (-1 < (char)uVar6) {
      (local_1d0.pVdbe)->expmask = 0;
    }
    if (__src == (char *)0x0) {
LAB_0016aafd:
      pcVar5 = (char *)0x0;
    }
    else {
      __n = (size_t)((int)local_1d0.zTail - (int)__src);
      pcVar5 = (char *)sqlite3DbMallocRawNN((local_1d0.pVdbe)->db,__n + 1);
      if (pcVar5 == (char *)0x0) goto LAB_0016aafd;
      memcpy(pcVar5,__src,__n);
      pcVar5[__n] = '\0';
    }
    pVVar3->zSql = pcVar5;
  }
  db_00 = local_1d0.db;
  if (db->mallocFailed == '\0') {
    if ((local_1d0.rc != 0) && (local_1d0.rc != 0x65)) goto LAB_0016ab1a;
    *local_1e0 = (sqlite3_stmt *)local_1d0.pVdbe;
    db->errCode = 0;
    db->errByteOffset = -1;
    p = db->pErr;
    iVar4 = 0;
    if (p != (Mem *)0x0) {
      iVar4 = 0;
      if ((p->flags & 0x9000) == 0) {
        p->flags = 1;
      }
      else {
        vdbeMemClearExternAndSetNull(p);
      }
    }
  }
  else {
    local_1d0.rc = 7;
    local_1d0.checkSchema = '\0';
LAB_0016ab1a:
    if (((local_1d0.checkSchema != '\0') && ((db->init).busy == '\0')) && (0 < (local_1d0.db)->nDb))
    {
      lVar7 = 0;
      lVar8 = 0;
      do {
        pBVar2 = *(Btree **)((long)&db_00->aDb->pBt + lVar7);
        if (pBVar2 != (Btree *)0x0) {
          uVar6 = pBVar2->inTrans;
          if ((uVar6 == '\0') && (iVar4 = sqlite3BtreeBeginTrans(pBVar2,0,(int *)0x0), iVar4 != 0))
          {
            if ((iVar4 == 0xc0a) || (iVar4 == 7)) {
              sqlite3OomFault(db_00);
              local_1d0.rc = 7;
            }
            break;
          }
          sqlite3BtreeGetMeta(pBVar2,1,&local_1e4);
          if (local_1e4 != **(u32 **)((long)&db_00->aDb->pSchema + lVar7)) {
            sqlite3ResetOneSchema(db_00,(int)lVar8);
            local_1d0.rc = 0x11;
          }
          if (uVar6 == '\0') {
            sqlite3BtreeCommit(pBVar2);
          }
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while (lVar8 < db_00->nDb);
    }
    if (local_1d0.pVdbe != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_1d0.pVdbe);
    }
    iVar4 = local_1d0.rc;
    if ((TriggerPrg *)local_1d0.zErrMsg == (TriggerPrg *)0x0) {
      sqlite3Error(db,local_1d0.rc);
    }
    else {
      sqlite3ErrorWithMsg(db,local_1d0.rc,"%s");
      if ((TriggerPrg *)local_1d0.zErrMsg != (TriggerPrg *)0x0) goto LAB_0016acbd;
    }
  }
  while (local_1d0.pTriggerPrg != (TriggerPrg *)0x0) {
    local_1d0.zErrMsg = (char *)local_1d0.pTriggerPrg;
    local_1d0.pTriggerPrg = (local_1d0.pTriggerPrg)->pNext;
LAB_0016acbd:
    sqlite3DbFreeNN(db,local_1d0.zErrMsg);
  }
LAB_0016acd2:
  sqlite3ParseObjectReset(&local_1d0);
  return iVar4;
}

Assistant:

static int sqlite3Prepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pReprepare,         /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc = SQLITE_OK;       /* Result code */
  int i;                    /* Loop counter */
  Parse sParse;             /* Parsing context */

  /* sqlite3ParseObjectInit(&sParse, db); // inlined for performance */
  memset(PARSE_HDR(&sParse), 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(&sParse), 0, PARSE_TAIL_SZ);
  sParse.pOuterParse = db->pParse;
  db->pParse = &sParse;
  sParse.db = db;
  sParse.pReprepare = pReprepare;
  assert( ppStmt && *ppStmt==0 );
  if( db->mallocFailed ) sqlite3ErrorMsg(&sParse, "out of memory");
  assert( sqlite3_mutex_held(db->mutex) );

  /* For a long-term use prepared statement avoid the use of
  ** lookaside memory.
  */
  if( prepFlags & SQLITE_PREPARE_PERSISTENT ){
    sParse.disableLookaside++;
    DisableLookaside;
  }
  sParse.prepFlags = prepFlags & 0xff;

  /* Check to verify that it is possible to get a read lock on all
  ** database schemas.  The inability to get a read lock indicates that
  ** some other database connection is holding a write-lock, which in
  ** turn means that the other connection has made uncommitted changes
  ** to the schema.
  **
  ** Were we to proceed and prepare the statement against the uncommitted
  ** schema changes and if those schema changes are subsequently rolled
  ** back and different changes are made in their place, then when this
  ** prepared statement goes to run the schema cookie would fail to detect
  ** the schema change.  Disaster would follow.
  **
  ** This thread is currently holding mutexes on all Btrees (because
  ** of the sqlite3BtreeEnterAll() in sqlite3LockAndPrepare()) so it
  ** is not possible for another thread to start a new schema change
  ** while this routine is running.  Hence, we do not need to hold
  ** locks on the schema, we just need to make sure nobody else is
  ** holding them.
  **
  ** Note that setting READ_UNCOMMITTED overrides most lock detection,
  ** but it does *not* override schema lock detection, so this all still
  ** works even if READ_UNCOMMITTED is set.
  */
  if( !db->noSharedCache ){
    for(i=0; i<db->nDb; i++) {
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        assert( sqlite3BtreeHoldsMutex(pBt) );
        rc = sqlite3BtreeSchemaLocked(pBt);
        if( rc ){
          const char *zDb = db->aDb[i].zDbSName;
          sqlite3ErrorWithMsg(db, rc, "database schema is locked: %s", zDb);
          testcase( db->flags & SQLITE_ReadUncommit );
          goto end_prepare;
        }
      }
    }
  }

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( db->pDisconnect ) sqlite3VtabUnlockList(db);
#endif

  if( nBytes>=0 && (nBytes==0 || zSql[nBytes-1]!=0) ){
    char *zSqlCopy;
    int mxLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
    testcase( nBytes==mxLen );
    testcase( nBytes==mxLen+1 );
    if( nBytes>mxLen ){
      sqlite3ErrorWithMsg(db, SQLITE_TOOBIG, "statement too long");
      rc = sqlite3ApiExit(db, SQLITE_TOOBIG);
      goto end_prepare;
    }
    zSqlCopy = sqlite3DbStrNDup(db, zSql, nBytes);
    if( zSqlCopy ){
      sqlite3RunParser(&sParse, zSqlCopy);
      sParse.zTail = &zSql[sParse.zTail-zSqlCopy];
      sqlite3DbFree(db, zSqlCopy);
    }else{
      sParse.zTail = &zSql[nBytes];
    }
  }else{
    sqlite3RunParser(&sParse, zSql);
  }
  assert( 0==sParse.nQueryLoop );

  if( pzTail ){
    *pzTail = sParse.zTail;
  }

  if( db->init.busy==0 ){
    sqlite3VdbeSetSql(sParse.pVdbe, zSql, (int)(sParse.zTail-zSql), prepFlags);
  }
  if( db->mallocFailed ){
    sParse.rc = SQLITE_NOMEM_BKPT;
    sParse.checkSchema = 0;
  }
  if( sParse.rc!=SQLITE_OK && sParse.rc!=SQLITE_DONE ){
    if( sParse.checkSchema && db->init.busy==0 ){
      schemaIsValid(&sParse);
    }
    if( sParse.pVdbe ){
      sqlite3VdbeFinalize(sParse.pVdbe);
    }
    assert( 0==(*ppStmt) );
    rc = sParse.rc;
    if( sParse.zErrMsg ){
      sqlite3ErrorWithMsg(db, rc, "%s", sParse.zErrMsg);
      sqlite3DbFree(db, sParse.zErrMsg);
    }else{
      sqlite3Error(db, rc);
    }
  }else{
    assert( sParse.zErrMsg==0 );
    *ppStmt = (sqlite3_stmt*)sParse.pVdbe;
    rc = SQLITE_OK;
    sqlite3ErrorClear(db);
  }


  /* Delete any TriggerPrg structures allocated while parsing this statement. */
  while( sParse.pTriggerPrg ){
    TriggerPrg *pT = sParse.pTriggerPrg;
    sParse.pTriggerPrg = pT->pNext;
    sqlite3DbFree(db, pT);
  }

end_prepare:

  sqlite3ParseObjectReset(&sParse);
  return rc;
}